

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFile.cpp
# Opt level: O2

void __thiscall blc::tools::VFile::~VFile(VFile *this)

{
  (this->super_stream)._vptr_stream = (_func_int **)&PTR_write_0011acc0;
  std::fstream::close();
  std::__cxx11::string::~string((string *)&this->_fileName);
  std::__cxx11::string::~string((string *)&this->_cache);
  std::fstream::~fstream(&this->_file);
  return;
}

Assistant:

blc::tools::VFile::~VFile() {
	this->_file.close();
}